

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

quad<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::encoder_strategy>
           *this,quad<unsigned_char> x,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  default_traits<unsigned_char,_charls::quad<unsigned_char>_> *this_00;
  array<charls::context_run_mode,_2UL> *context;
  uint predicted_value;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int32_t error_value;
  int32_t error_value_00;
  uint predicted_value_00;
  int32_t error_value_01;
  int32_t error_value_02;
  uint predicted_value_01;
  uint uVar5;
  uint uVar6;
  uint predicted_value_02;
  uint uVar7;
  uint uVar8;
  
  predicted_value = (uint)rb >> 0x18;
  predicted_value_01 = (uint)rb & 0xff;
  uVar7 = -(uint)(predicted_value_01 < ((uint)ra & 0xff)) | 1;
  this_00 = &this->traits_;
  error_value = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_error_value
                          (this_00,(((uint)x & 0xff) - predicted_value_01) * uVar7);
  context = &this->context_run_mode_;
  encode_run_interruption_error(this,context->_M_elems,error_value);
  predicted_value_02 = (uint)rb >> 8 & 0xff;
  uVar5 = -(uint)(predicted_value_02 < ((uint)ra >> 8 & 0xff)) | 1;
  error_value_00 =
       default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_error_value
                 (this_00,(((uint)x >> 8 & 0xff) - predicted_value_02) * uVar5);
  encode_run_interruption_error(this,context->_M_elems,error_value_00);
  predicted_value_00 = (uint)rb >> 0x10 & 0xff;
  uVar8 = -(uint)(predicted_value_00 < ((uint)ra >> 0x10 & 0xff)) | 1;
  error_value_01 =
       default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_error_value
                 (this_00,(((uint)x >> 0x10 & 0xff) - predicted_value_00) * uVar8);
  encode_run_interruption_error(this,context->_M_elems,error_value_01);
  uVar6 = -(uint)(predicted_value < (uint)ra >> 0x18) | 1;
  error_value_02 =
       default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_error_value
                 (this_00,(((uint)x >> 0x18) - predicted_value) * uVar6);
  encode_run_interruption_error(this,context->_M_elems,error_value_02);
  bVar1 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,predicted_value_01,uVar7 * error_value);
  bVar2 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,predicted_value_02,uVar5 * error_value_00);
  bVar3 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,predicted_value_00,uVar8 * error_value_01);
  bVar4 = default_traits<unsigned_char,_charls::quad<unsigned_char>_>::compute_reconstructed_sample
                    (this_00,predicted_value,uVar6 * error_value_02);
  return (quad<unsigned_char>)
         ((uint)bVar4 << 0x18 | (uint)bVar1 | (uint)bVar2 << 8 | (uint)bVar3 << 0x10);
}

Assistant:

quad<sample_type> encode_run_interruption_pixel(const quad<sample_type> x, const quad<sample_type> ra,
                                                    const quad<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        const int32_t error_value4{traits_.compute_error_value(sign(rb.v4 - ra.v4) * (x.v4 - rb.v4))};
        encode_run_interruption_error(context_run_mode_[0], error_value4);

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }